

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O3

void __thiscall cmCTestGlobalVC::WriteXMLGlobal(cmCTestGlobalVC *this,cmXMLWriter *xml)

{
  size_t __n;
  int iVar1;
  string local_40;
  
  if ((this->NewRevision)._M_string_length != 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Revision","");
    cmXMLWriter::StartElement(xml,&local_40);
    cmXMLWriter::Content<std::__cxx11::string>(xml,&this->NewRevision);
    cmXMLWriter::EndElement(xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  __n = (this->OldRevision)._M_string_length;
  if (__n != 0) {
    if ((__n == (this->NewRevision)._M_string_length) &&
       (iVar1 = bcmp((this->OldRevision)._M_dataplus._M_p,(this->NewRevision)._M_dataplus._M_p,__n),
       iVar1 == 0)) {
      return;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"PriorRevision","");
    cmXMLWriter::StartElement(xml,&local_40);
    cmXMLWriter::Content<std::__cxx11::string>(xml,&this->OldRevision);
    cmXMLWriter::EndElement(xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLGlobal(cmXMLWriter& xml)
{
  if(!this->NewRevision.empty())
    {
    xml.Element("Revision", this->NewRevision);
    }
  if(!this->OldRevision.empty() && this->OldRevision != this->NewRevision)
    {
    xml.Element("PriorRevision", this->OldRevision);
    }
}